

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io.c
# Opt level: O0

int gdGetWord(int *result,gdIOCtx *ctx)

{
  int iVar1;
  int r;
  gdIOCtx *ctx_local;
  int *result_local;
  
  iVar1 = (*ctx->getC)(ctx);
  if (iVar1 == -1) {
    result_local._4_4_ = 0;
  }
  else {
    *result = iVar1 << 8;
    iVar1 = (*ctx->getC)(ctx);
    if (iVar1 == -1) {
      result_local._4_4_ = 0;
    }
    else {
      *result = iVar1 + *result;
      result_local._4_4_ = 1;
    }
  }
  return result_local._4_4_;
}

Assistant:

int gdGetWord(int *result, gdIOCtx *ctx)
{
	int r;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result = r << 8;

	r = (ctx->getC)(ctx);
	if(r == EOF) {
		return 0;
	}

	*result += r;

	return 1;
}